

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O2

void fdb_kvs_set_seqnum(filemgr *file,fdb_kvs_id_t id,fdb_seqnum_t seqnum)

{
  pthread_spinlock_t *__lock;
  kvs_header *pkVar1;
  avl_node *paVar2;
  kvs_node query;
  avl_node local_38;
  
  if (id != 0) {
    pkVar1 = file->kv_header;
    __lock = &pkVar1->lock;
    pthread_spin_lock(__lock);
    paVar2 = avl_search(pkVar1->idx_id,&local_38,_kvs_cmp_id);
    paVar2[-7].parent = (avl_node *)seqnum;
    pthread_spin_unlock(__lock);
    return;
  }
  filemgr_set_seqnum(file,seqnum);
  return;
}

Assistant:

void fdb_kvs_set_seqnum(struct filemgr *file,
                           fdb_kvs_id_t id,
                           fdb_seqnum_t seqnum)
{
    struct kvs_header *kv_header = file->kv_header;
    struct kvs_node query, *node;
    struct avl_node *a;

    if (id == 0) {
        // default KV instance
        filemgr_set_seqnum(file, seqnum);
        return;
    }

    spin_lock(&kv_header->lock);
    query.id = id;
    a = avl_search(kv_header->idx_id, &query.avl_id, _kvs_cmp_id);
    node = _get_entry(a, struct kvs_node, avl_id);
    node->seqnum = seqnum;
    spin_unlock(&kv_header->lock);
}